

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O1

int __thiscall
vk::DescriptorSetUpdateBuilder::copy
          (DescriptorSetUpdateBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  pointer *ppVVar1;
  iterator __position;
  undefined4 in_ECX;
  deUint64 in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  VkCopyDescriptorSet local_40;
  
  local_40.sType = VK_STRUCTURE_TYPE_COPY_DESCRIPTOR_SET;
  local_40.pNext = (void *)0x0;
  local_40.srcBinding = (deUint32)src;
  __position._M_current =
       (this->m_copies).
       super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_copies).
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_40.srcSet.m_internal = (deUint64)dst;
    std::vector<vk::VkCopyDescriptorSet,std::allocator<vk::VkCopyDescriptorSet>>::
    _M_realloc_insert<vk::VkCopyDescriptorSet_const&>
              ((vector<vk::VkCopyDescriptorSet,std::allocator<vk::VkCopyDescriptorSet>> *)
               &this->m_copies,__position,&local_40);
  }
  else {
    *(ulong *)&(__position._M_current)->descriptorCount =
         CONCAT44(local_40._52_4_,in_stack_00000010);
    ((__position._M_current)->dstSet).m_internal = in_R8;
    (__position._M_current)->dstBinding = in_R9D;
    (__position._M_current)->dstArrayElement = in_stack_00000008;
    ((__position._M_current)->srcSet).m_internal = (deUint64)dst;
    (__position._M_current)->srcBinding = local_40.srcBinding;
    (__position._M_current)->srcArrayElement = in_ECX;
    *(ulong *)__position._M_current = CONCAT44(local_40._4_4_,0x24);
    (__position._M_current)->pNext = (void *)0x0;
    ppVVar1 = &(this->m_copies).
               super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return (int)this;
}

Assistant:

DescriptorSetUpdateBuilder& DescriptorSetUpdateBuilder::copy (VkDescriptorSet	srcSet,
															  deUint32			srcBinding,
															  deUint32			srcArrayElement,
															  VkDescriptorSet	destSet,
															  deUint32			destBinding,
															  deUint32			destArrayElement,
															  deUint32			count)
{
	const VkCopyDescriptorSet copyParams =
	{
		VK_STRUCTURE_TYPE_COPY_DESCRIPTOR_SET,
		DE_NULL,
		srcSet,				//!< srcSet
		srcBinding,			//!< srcBinding
		srcArrayElement,	//!< srcArrayElement
		destSet,			//!< destSet
		destBinding,		//!< destBinding
		destArrayElement,	//!< destArrayElement
		count,				//!< count
	};
	m_copies.push_back(copyParams);
	return *this;
}